

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O0

bool __thiscall libwebm::VpxPesParser::ParsePesHeader(VpxPesParser *this,PesHeader *header)

{
  bool bVar1;
  reference pvVar2;
  uint8_t *a;
  uint8_t *__end1;
  uint8_t *__begin1;
  uint8_t (*__range1) [4];
  size_t pos;
  PesHeader *header_local;
  VpxPesParser *this_local;
  
  if ((header == (PesHeader *)0x0) || (*(int *)(this + 0x78) != 1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = VerifyPacketStartCode(this);
    if (bVar1) {
      __range1 = *(uint8_t (**) [4])(this + 0x70);
      for (__end1 = header->start_code; (uint16_t *)__end1 != &header->packet_length;
          __end1 = __end1 + 1) {
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x58),
                            (size_type)__range1);
        *__end1 = *pvVar2;
        __range1 = (uint8_t (*) [4])(*__range1 + 1);
      }
      bVar1 = ReadStreamId(this,&header->stream_id);
      if (bVar1) {
        if ((header->stream_id < (byte)*this) || ((byte)this[1] < header->stream_id)) {
          this_local._7_1_ = false;
        }
        else {
          bVar1 = ReadPacketLength(this,&header->packet_length);
          if (bVar1) {
            *(long *)(this + 0x70) = *(long *)(this + 8) + *(long *)(this + 0x70);
            *(undefined4 *)(this + 0x78) = 2;
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VpxPesParser::ParsePesHeader(PesHeader* header) {
  if (!header || parse_state_ != kParsePesHeader)
    return false;

  if (!VerifyPacketStartCode())
    return false;

  std::size_t pos = read_pos_;
  for (auto& a : header->start_code) {
    a = pes_file_data_[pos++];
  }

  // PES Video stream IDs start at E0.
  if (!ReadStreamId(&header->stream_id))
    return false;

  if (header->stream_id < kMinVideoStreamId ||
      header->stream_id > kMaxVideoStreamId)
    return false;

  if (!ReadPacketLength(&header->packet_length))
    return false;

  read_pos_ += kPesHeaderSize;
  parse_state_ = kParsePesOptionalHeader;
  return true;
}